

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

uint8_t * IpmiFruAddString(uint8_t *pos,char *str)

{
  size_t sVar1;
  int local_1c;
  int len;
  char *str_local;
  uint8_t *pos_local;
  
  sVar1 = strlen(str);
  local_1c = (int)sVar1;
  if (local_1c == 1) {
    local_1c = 2;
  }
  else if (0x3f < local_1c) {
    local_1c = 0x3f;
  }
  str_local = (char *)(pos + 1);
  *pos = (char)local_1c + 0xc0;
  if (local_1c != 0) {
    memcpy(str_local,str,(long)local_1c);
    str_local = (char *)((uint8_t *)str_local + local_1c);
  }
  return (uint8_t *)str_local;
}

Assistant:

uint8_t *IpmiFruAddString(uint8_t *pos, const char *str)
{
    int len = strlen(str);
    if (len == 1) {
        len ++;
    } else if (len > 63) {
        len = 63;
    }
    *pos++ = 0xC0 + len;
    if (len) {
        memcpy(pos, str, len);
        pos += len;
    }
    return pos;
}